

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_mul_2(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *pmVar2;
  mp_digit *pmVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  iVar5 = a->used;
  if (b->alloc <= iVar5) {
    iVar5 = mp_grow(b,iVar5 + 1);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = a->used;
  }
  iVar1 = b->used;
  b->used = iVar5;
  pmVar2 = a->dp;
  pmVar3 = b->dp;
  lVar6 = 0;
  iVar7 = a->used;
  if (a->used < 1) {
    iVar7 = 0;
  }
  uVar8 = 0;
  for (; iVar7 != (int)lVar6; lVar6 = lVar6 + 1) {
    uVar4 = pmVar2[lVar6];
    pmVar3[lVar6] = uVar4 * 2 & 0xffffffffffffffe | uVar8;
    uVar8 = uVar4 >> 0x3b;
  }
  if (uVar8 != 0) {
    pmVar3[lVar6] = 1;
    iVar5 = iVar5 + 1;
    b->used = iVar5;
  }
  for (lVar6 = (long)iVar5; (int)lVar6 < iVar1; lVar6 = lVar6 + 1) {
    pmVar3[lVar6] = 0;
  }
  b->sign = a->sign;
  return 0;
}

Assistant:

int mp_mul_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* grow to accomodate result */
  if (b->alloc < a->used + 1) {
    if ((res = mp_grow (b, a->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;

  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* alias for source */
    tmpa = a->dp;
    
    /* alias for dest */
    tmpb = b->dp;

    /* carry */
    r = 0;
    for (x = 0; x < a->used; x++) {
    
      /* get what will be the *next* carry bit from the 
       * MSB of the current digit 
       */
      rr = *tmpa >> ((mp_digit)(DIGIT_BIT - 1));
      
      /* now shift up this digit, add in the carry [from the previous] */
      *tmpb++ = ((*tmpa++ << ((mp_digit)1)) | r) & MP_MASK;
      
      /* copy the carry that would be from the source 
       * digit into the next iteration 
       */
      r = rr;
    }

    /* new leading digit? */
    if (r != 0) {
      /* add a MSB which is always 1 at this point */
      *tmpb = 1;
      ++(b->used);
    }

    /* now zero any excess digits on the destination 
     * that we didn't write to 
     */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  return MP_OKAY;
}